

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O0

bool vkt::sr::isImageSizeSupported
               (VkImageType imageType,UVec3 *imageSize,VkPhysicalDeviceLimits *limits)

{
  uint uVar1;
  bool local_27;
  bool local_26;
  bool local_25;
  VkPhysicalDeviceLimits *limits_local;
  UVec3 *imageSize_local;
  VkImageType imageType_local;
  
  if (imageType == VK_IMAGE_TYPE_1D) {
    uVar1 = tcu::Vector<unsigned_int,_3>::x(imageSize);
    local_25 = false;
    if (uVar1 <= limits->maxImageDimension1D) {
      uVar1 = tcu::Vector<unsigned_int,_3>::y(imageSize);
      local_25 = false;
      if (uVar1 == 1) {
        uVar1 = tcu::Vector<unsigned_int,_3>::z(imageSize);
        local_25 = uVar1 == 1;
      }
    }
    imageSize_local._7_1_ = local_25;
  }
  else if (imageType == VK_IMAGE_TYPE_2D) {
    uVar1 = tcu::Vector<unsigned_int,_3>::x(imageSize);
    local_26 = false;
    if (uVar1 <= limits->maxImageDimension2D) {
      uVar1 = tcu::Vector<unsigned_int,_3>::y(imageSize);
      local_26 = false;
      if (uVar1 <= limits->maxImageDimension2D) {
        uVar1 = tcu::Vector<unsigned_int,_3>::z(imageSize);
        local_26 = uVar1 == 1;
      }
    }
    imageSize_local._7_1_ = local_26;
  }
  else if (imageType == VK_IMAGE_TYPE_3D) {
    uVar1 = tcu::Vector<unsigned_int,_3>::x(imageSize);
    local_27 = false;
    if (uVar1 <= limits->maxImageDimension3D) {
      uVar1 = tcu::Vector<unsigned_int,_3>::y(imageSize);
      local_27 = false;
      if (uVar1 <= limits->maxImageDimension3D) {
        uVar1 = tcu::Vector<unsigned_int,_3>::z(imageSize);
        local_27 = uVar1 <= limits->maxImageDimension3D;
      }
    }
    imageSize_local._7_1_ = local_27;
  }
  else {
    imageSize_local._7_1_ = false;
  }
  return imageSize_local._7_1_;
}

Assistant:

bool isImageSizeSupported (const VkImageType imageType, const tcu::UVec3& imageSize, const vk::VkPhysicalDeviceLimits& limits)
{
	switch (imageType)
	{
		case VK_IMAGE_TYPE_1D:
			return (imageSize.x() <= limits.maxImageDimension1D
				 && imageSize.y() == 1
				 && imageSize.z() == 1);
		case VK_IMAGE_TYPE_2D:
			return (imageSize.x() <= limits.maxImageDimension2D
				 && imageSize.y() <= limits.maxImageDimension2D
				 && imageSize.z() == 1);
		case VK_IMAGE_TYPE_3D:
			return (imageSize.x() <= limits.maxImageDimension3D
				 && imageSize.y() <= limits.maxImageDimension3D
				 && imageSize.z() <= limits.maxImageDimension3D);
		default:
			DE_FATAL("Unknown image type");
			return false;
	}
}